

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_node.hpp
# Opt level: O2

void duckdb::BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::Free(ART *art,Node *node)

{
  BaseNode<(unsigned_char)__x04_,_(duckdb::NType)3> *pBVar1;
  uint8_t i;
  ulong uVar2;
  BaseNode<(unsigned_char)__x04_,_(duckdb::NType)3> *node_00;
  
  pBVar1 = Node::Ref<duckdb::BaseNode<(unsigned_char)4,(duckdb::NType)3>>
                     (art,(Node)(node->super_IndexPointer).data,NODE_4);
  node_00 = pBVar1;
  for (uVar2 = 0; node_00 = (BaseNode<(unsigned_char)__x04_,_(duckdb::NType)3> *)node_00->children,
      uVar2 < pBVar1->count; uVar2 = uVar2 + 1) {
    Node::Free(art,(Node *)node_00);
  }
  return;
}

Assistant:

static void Free(ART &art, Node &node) {
		auto &n = Node::Ref<BaseNode>(art, node, TYPE);
		for (uint8_t i = 0; i < n.count; i++) {
			Node::Free(art, n.children[i]);
		}
	}